

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O0

string * __thiscall MemTable::get_abi_cxx11_(MemTable *this,longlong k)

{
  bool bVar1;
  iterator level;
  Result RVar2;
  MemTable *local_48;
  bool valid;
  longlong k_local;
  MemTable *this_local;
  
  bVar1 = std::__cxx11::
          list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::empty
                    (&this->qlist);
  if (bVar1) {
    this_local = (MemTable *)0x0;
  }
  else {
    level = std::__cxx11::
            list<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>::begin
                      (&this->qlist);
    RVar2 = skipSearch(this,(LevelIter)level._M_node,k);
    if ((((RVar2.node)->data).key == k) &&
       (((undefined1  [16])RVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
      local_48 = (MemTable *)&((RVar2.node)->data).value;
    }
    else {
      local_48 = (MemTable *)0x0;
    }
    this_local = local_48;
  }
  return (string *)this_local;
}

Assistant:

std::string *MemTable::get(long long k) {
    if (qlist.empty()) return nullptr;
    auto[valid, res] = skipSearch(qlist.begin(), k);
    return res->data.key == k && valid ? &(res->data.value) : nullptr;
}